

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_list_stroke_line(nk_draw_list *list,nk_vec2 a,nk_vec2 b,nk_color col,float thickness)

{
  nk_vec2 nVar1;
  float fStack_58;
  float local_54;
  float fStack_40;
  float local_3c;
  float thickness_local;
  nk_draw_list *list_local;
  float fStack_18;
  nk_color col_local;
  nk_vec2 b_local;
  nk_vec2 a_local;
  
  if (list == (nk_draw_list *)0x0) {
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x2750,
                  "void nk_draw_list_stroke_line(struct nk_draw_list *, struct nk_vec2, struct nk_vec2, struct nk_color, float)"
                 );
  }
  if ((list != (nk_draw_list *)0x0) && (list_local._7_1_ = col.a, list_local._7_1_ != '\0')) {
    if (list->line_AA == NK_ANTI_ALIASING_ON) {
      nk_draw_list_path_line_to(list,a);
      nk_draw_list_path_line_to(list,b);
    }
    else {
      b_local.x = a.x;
      nVar1 = nk_vec2(0.5,0.5);
      local_3c = nVar1.x;
      b_local.y = a.y;
      nVar1 = nk_vec2(0.5,0.5);
      fStack_40 = nVar1.y;
      nVar1 = nk_vec2(b_local.x - local_3c,b_local.y - fStack_40);
      nk_draw_list_path_line_to(list,nVar1);
      fStack_18 = b.x;
      nVar1 = nk_vec2(0.5,0.5);
      local_54 = nVar1.x;
      col_local = (nk_color)b.y;
      nVar1 = nk_vec2(0.5,0.5);
      fStack_58 = nVar1.y;
      nVar1 = nk_vec2(fStack_18 - local_54,(float)col_local - fStack_58);
      nk_draw_list_path_line_to(list,nVar1);
    }
    nk_draw_list_path_stroke(list,col,NK_STROKE_OPEN,thickness);
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_stroke_line(struct nk_draw_list *list, struct nk_vec2 a,
    struct nk_vec2 b, struct nk_color col, float thickness)
{
    NK_ASSERT(list);
    if (!list || !col.a) return;
    if (list->line_AA == NK_ANTI_ALIASING_ON) {
        nk_draw_list_path_line_to(list, a);
        nk_draw_list_path_line_to(list, b);
    } else {
        nk_draw_list_path_line_to(list, nk_vec2_sub(a,nk_vec2(0.5f,0.5f)));
        nk_draw_list_path_line_to(list, nk_vec2_sub(b,nk_vec2(0.5f,0.5f)));
    }
    nk_draw_list_path_stroke(list,  col, NK_STROKE_OPEN, thickness);
}